

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

bool __thiscall
cmFindProgramCommand::InitialPass
          (cmFindProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  bool bVar1;
  int iVar2;
  string result;
  string sStack_38;
  
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName);
  iVar2 = (*(this->super_cmFindBase)._vptr_cmFindBase[2])(this,argsIn);
  if (SUB41(iVar2,0) != false) {
    bVar1 = cmFindCommon::ComputeIfDebugModeWanted
                      (&(this->super_cmFindBase).super_cmFindCommon,
                       &(this->super_cmFindBase).VariableName);
    (this->super_cmFindBase).super_cmFindCommon.DebugMode = bVar1;
    if ((this->super_cmFindBase).AlreadyDefined == true) {
      cmFindBase::NormalizeFindResult(&this->super_cmFindBase);
    }
    else {
      FindProgram_abi_cxx11_(&sStack_38,this);
      cmFindBase::StoreFindResult(&this->super_cmFindBase,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool cmFindProgramCommand::InitialPass(std::vector<std::string> const& argsIn)
{

  this->CMakePathName = "PROGRAM";

  // call cmFindBase::ParseArguments
  if (!this->ParseArguments(argsIn)) {
    return false;
  }
  this->DebugMode = this->ComputeIfDebugModeWanted(this->VariableName);

  if (this->AlreadyDefined) {
    this->NormalizeFindResult();
    return true;
  }

  std::string const result = this->FindProgram();
  this->StoreFindResult(result);
  return true;
}